

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O0

void anon_unknown.dwarf_41187::adjustTableSize(Module *wasm,int initialSize,bool secondary)

{
  bool bVar1;
  ulong uVar2;
  pointer pTVar3;
  address64_t aVar4;
  Fatal *pFVar5;
  uint64_t a;
  Fatal local_4c8;
  Fatal local_340;
  reference local_1b8;
  value_type *table;
  Fatal local_1a0;
  byte local_15;
  int local_14;
  bool secondary_local;
  Module *pMStack_10;
  int initialSize_local;
  Module *wasm_local;
  
  if (-1 < initialSize) {
    local_15 = secondary;
    local_14 = initialSize;
    pMStack_10 = wasm;
    bVar1 = std::
            vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ::empty(&wasm->tables);
    if (bVar1) {
      if ((local_15 & 1) == 0) {
        ::wasm::Fatal::Fatal(&local_1a0);
        ::wasm::Fatal::operator<<
                  (&local_1a0,(char (*) [43])"--initial-table used but there is no table");
        ::wasm::Fatal::~Fatal(&local_1a0);
      }
    }
    else {
      local_1b8 = std::
                  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                  ::front(&pMStack_10->tables);
      uVar2 = (ulong)local_14;
      pTVar3 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         (local_1b8);
      aVar4 = ::wasm::Address::operator_cast_to_unsigned_long(&pTVar3->initial);
      if (uVar2 < aVar4) {
        ::wasm::Fatal::Fatal(&local_340);
        pFVar5 = ::wasm::Fatal::operator<<
                           (&local_340,
                            (char (*) [60])
                            "Specified initial table size too small, should be at least ");
        pTVar3 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                           (local_1b8);
        ::wasm::Fatal::operator<<(pFVar5,&pTVar3->initial);
        ::wasm::Fatal::~Fatal(&local_340);
      }
      uVar2 = (ulong)local_14;
      pTVar3 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         (local_1b8);
      aVar4 = ::wasm::Address::operator_cast_to_unsigned_long(&pTVar3->max);
      if (aVar4 < uVar2) {
        ::wasm::Fatal::Fatal(&local_4c8);
        pFVar5 = ::wasm::Fatal::operator<<
                           (&local_4c8,
                            (char (*) [57])
                            "Specified initial table size larger than max table size ");
        pTVar3 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                           (local_1b8);
        ::wasm::Fatal::operator<<(pFVar5,&pTVar3->max);
        ::wasm::Fatal::~Fatal(&local_4c8);
      }
      a = (uint64_t)local_14;
      pTVar3 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         (local_1b8);
      ::wasm::Address::operator=(&pTVar3->initial,a);
    }
  }
  return;
}

Assistant:

void adjustTableSize(Module& wasm, int initialSize, bool secondary = false) {
  if (initialSize < 0) {
    return;
  }
  if (wasm.tables.empty()) {
    if (secondary) {
      // It's not a problem if the table is not used in the secondary module.
      return;
    }
    Fatal() << "--initial-table used but there is no table";
  }

  auto& table = wasm.tables.front();

  if ((uint64_t)initialSize < table->initial) {
    Fatal() << "Specified initial table size too small, should be at least "
            << table->initial;
  }
  if ((uint64_t)initialSize > table->max) {
    Fatal() << "Specified initial table size larger than max table size "
            << table->max;
  }
  table->initial = initialSize;
}